

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
LabelObjectState<true>::EndObject(LabelObjectState<true> *this,Context<true> *ctx,SizeType param_3)

{
  long in_RSI;
  cb_class *in_RDI;
  label *ld;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (((uint)in_RDI[2].probability & 0x100) == 0) {
    if (((uint)in_RDI[2].probability & 1) != 0) {
      count_label((shared_data *)**(undefined8 **)(in_RSI + 8),
                  *(float *)(*(long *)(in_RSI + 0x50) + 0x6828));
      *(undefined1 *)&in_RDI[2].probability = 0;
    }
  }
  else {
    v_array<CB::cb_class>::push_back
              ((v_array<CB::cb_class> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
    *(undefined1 *)((long)&in_RDI[2].probability + 1) = 0;
    in_RDI[1].probability = 0.0;
    in_RDI[1].partial_prediction = 0.0;
    in_RDI[2].cost = 0.0;
    in_RDI[2].action = 0;
  }
  return *(BaseState<true> **)(in_RDI + 1);
}

Assistant:

BaseState<audit>* EndObject(Context<audit>& ctx, rapidjson::SizeType)
  {
    if (found_cb)
    {
      CB::label* ld = (CB::label*)&ctx.ex->l;
      ld->costs.push_back(cb_label);

      found_cb = false;
      cb_label = {0., 0, 0., 0.};
    }
    else if (found)
    {
      count_label(ctx.all->sd, ctx.ex->l.simple.label);

      found = false;
    }

    return return_state;
  }